

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall
TagVisitor<ModuleDefinitionFileTag,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
::~TagVisitor(TagVisitor<ModuleDefinitionFileTag,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
              *this)

{
  reportBadObjLib(&this->BadObjLibFiles,this->Target,this->GlobalGenerator->CMakeInstance);
  cmsys::RegularExpression::~RegularExpression(&this->Header);
  std::_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Vector_base
            (&(this->BadObjLibFiles).
              super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>);
  return;
}

Assistant:

~TagVisitor()
  {
    reportBadObjLib(this->BadObjLibFiles, this->Target,
                    this->GlobalGenerator->GetCMakeInstance());
  }